

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::OptHoistUpdateValueType
          (GlobOpt *this,Loop *loop,Instr *instr,Opnd **srcOpndPtr,Value *opndVal)

{
  undefined1 *puVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 other;
  Opnd *this_00;
  BasicBlock *block;
  ValueInfo *pVVar2;
  Instr *this_01;
  code *pcVar3;
  Loop *pLVar4;
  bool bVar5;
  Sym *sym;
  Value *pVVar6;
  undefined4 *puVar7;
  RegOpnd *this_02;
  Opnd *src1Opnd;
  Instr *pIVar8;
  PropertySym *pPVar9;
  SymOpnd *pSVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Loop *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType opndValueTypeInLandingPad;
  
  if ((((opndVal == (Value *)0x0) || (srcOpndPtr == (Opnd **)0x0)) || (instr->m_opcode == FromVar))
     || (this_00 = *srcOpndPtr, this_00 == (Opnd *)0x0)) {
    return;
  }
  local_40 = loop;
  sym = IR::Opnd::GetSym(this_00);
  if (sym == (Sym *)0x0) {
    return;
  }
  block = local_40->landingPad;
  pVVar6 = GlobOptBlockData::FindValue(&block->globOptData,sym);
  if (opndVal->valueNumber != pVVar6->valueNumber) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,14999,
                       "(opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber())",
                       "opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber()");
    if (!bVar5) goto LAB_00440851;
    *puVar7 = 0;
  }
  other = (anon_union_2_4_ea848c7b_for_ValueType_13)
          *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
           &(pVVar6->valueInfo->super_ValueType).field_0.field_0;
  local_42 = (this_00->m_valueType).field_0;
  local_32[0] = other;
  bVar5 = ValueType::operator!=((ValueType *)&local_42.field_0,(ValueType)other);
  if ((!bVar5) ||
     (IR::Opnd::SetValueType(this_00,(ValueType)other), instr->m_opcode != SetConcatStrMultiItemBE))
  {
    if (sym->m_kind != SymKindProperty) {
      return;
    }
    pPVar9 = Sym::AsPropertySym(sym);
    pVVar6 = GlobOptBlockData::FindValue(&block->globOptData,&pPVar9->m_stackSym->super_Sym);
    pVVar2 = pVVar6->valueInfo;
    pSVar10 = IR::Opnd::AsSymOpnd(this_00);
    (pSVar10->propertyOwnerValueType).field_0 = (pVVar2->super_ValueType).field_0;
    return;
  }
  if (sym->m_kind == SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3aa1,"(!opndSym->IsPropertySym())","!opndSym->IsPropertySym()");
    if (!bVar5) goto LAB_00440851;
    *puVar7 = 0;
  }
  bVar5 = ValueType::IsString((ValueType *)&local_32[0].field_0);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3aa2,"(!opndValueTypeInLandingPad.IsString())",
                       "!opndValueTypeInLandingPad.IsString()");
    if (!bVar5) goto LAB_00440851;
    *puVar7 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3aa3,"(instr->GetDst())","instr->GetDst()");
    if (!bVar5) {
LAB_00440851:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this_02 = IR::RegOpnd::New(TyVar,instr->m_func);
  IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)0x800);
  puVar1 = &(this_02->super_Opnd).field_0xb;
  *puVar1 = *puVar1 | 1;
  src1Opnd = IR::Opnd::Use(this_00,instr->m_func);
  pIVar8 = IR::Instr::New(Conv_PrimStr,&this_02->super_Opnd,src1Opnd,instr->m_func);
  IR::Instr::ReplaceSrc(instr,this_00,&this_02->super_Opnd);
  *srcOpndPtr = &this_02->super_Opnd;
  bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveFields);
  bVar5 = IsImplicitCallBailOutCurrentlyNeeded
                    (this,pIVar8,pVVar6,(Value *)0x0,block,bVar5,true,true,false);
  pLVar4 = local_40;
  if (bVar5) {
    EnsureBailTarget(this,local_40);
    IR::Instr::InsertBefore(pLVar4->bailOutInfo->bailOutInstr,pIVar8);
    pIVar8 = IR::Instr::ConvertToBailOutInstr
                       (pIVar8,pIVar8,BailOutOnImplicitCallsPreOp,pLVar4->bailOutInfo->bailOutOffset
                       );
    IR::Instr::ReplaceBailOutInfo(pIVar8,pLVar4->bailOutInfo);
    return;
  }
  this_01 = local_40->bailOutInfo->bailOutInstr;
  if (this_01 == (Instr *)0x0) {
    BasicBlock::InsertAfter(block,pIVar8);
    return;
  }
  IR::Instr::InsertBefore(this_01,pIVar8);
  return;
}

Assistant:

void
GlobOpt::OptHoistUpdateValueType(
    Loop* loop,
    IR::Instr* instr,
    IR::Opnd** srcOpndPtr /* All code paths that change src, should update srcOpndPtr*/,
    Value* opndVal)
{
    if (opndVal == nullptr || instr->m_opcode == Js::OpCode::FromVar || srcOpndPtr == nullptr || *srcOpndPtr == nullptr)
    {
        return;
    }

    IR::Opnd* srcOpnd = *srcOpndPtr;

    Sym* opndSym = srcOpnd->GetSym();;

    if (opndSym)
    {
        BasicBlock* landingPad = loop->landingPad;
        Value* opndValueInLandingPad = landingPad->globOptData.FindValue(opndSym);
        Assert(opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber());

        ValueType opndValueTypeInLandingPad = opndValueInLandingPad->GetValueInfo()->Type();

        if (srcOpnd->GetValueType() != opndValueTypeInLandingPad)
        {
            srcOpnd->SetValueType(opndValueTypeInLandingPad);

            if (instr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE)
            {
                Assert(!opndSym->IsPropertySym());
                Assert(!opndValueTypeInLandingPad.IsString());
                Assert(instr->GetDst());

                IR::RegOpnd* strOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
                strOpnd->SetValueType(ValueType::String);
                strOpnd->SetValueTypeFixed();
                IR::Instr* convPrimStrInstr =
                    IR::Instr::New(Js::OpCode::Conv_PrimStr, strOpnd, srcOpnd->Use(instr->m_func), instr->m_func);
                instr->ReplaceSrc(srcOpnd, strOpnd);

                // Replace above will free srcOpnd, so reassign it
                *srcOpndPtr = srcOpnd = reinterpret_cast<IR::Opnd *>(strOpnd);

                // We add ConvPrim_Str in the landingpad, and since this instruction doesn't go through the checks in OptInstr, the bailout is never added
                // As we expand hoisting of instructions to new opcode, we need a better framework to handle such cases
                if (IsImplicitCallBailOutCurrentlyNeeded(convPrimStrInstr, opndValueInLandingPad, nullptr, landingPad, landingPad->globOptData.liveFields->IsEmpty(), true, true))
                {
                    EnsureBailTarget(loop);
                    loop->bailOutInfo->bailOutInstr->InsertBefore(convPrimStrInstr);
                    convPrimStrInstr = convPrimStrInstr->ConvertToBailOutInstr(convPrimStrInstr, IR::BailOutOnImplicitCallsPreOp, loop->bailOutInfo->bailOutOffset);
                    convPrimStrInstr->ReplaceBailOutInfo(loop->bailOutInfo);
                }
                else
                {
                    if (loop->bailOutInfo->bailOutInstr)
                    {
                        loop->bailOutInfo->bailOutInstr->InsertBefore(convPrimStrInstr);
                    }
                    else
                    {
                        landingPad->InsertAfter(convPrimStrInstr);
                    }
                }

                // If we came here opndSym can't be PropertySym
                return;
            }
        }


        if (opndSym->IsPropertySym())
        {
            // Also fix valueInfo on objPtr
            StackSym* opndObjPtrSym = opndSym->AsPropertySym()->m_stackSym;
            Value* opndObjPtrSymValInLandingPad = landingPad->globOptData.FindValue(opndObjPtrSym);
            ValueInfo* opndObjPtrSymValueInfoInLandingPad = opndObjPtrSymValInLandingPad->GetValueInfo();

            srcOpnd->AsSymOpnd()->SetPropertyOwnerValueType(opndObjPtrSymValueInfoInLandingPad->Type());
        }
    }
}